

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse_array(Parser *this)

{
  Type TVar1;
  Token *pTVar2;
  AbstractSyntaxNode *pAVar3;
  ostream *poVar4;
  parser_exception *this_00;
  Type local_3ac;
  Token local_3a8;
  undefined1 local_349;
  string local_348;
  int local_324;
  TokenPosition local_320;
  int local_304;
  string local_300;
  Type local_2dc;
  Token local_2d8;
  int local_27c [3];
  Token local_270;
  int local_214 [6];
  Type local_1fc;
  Token local_1f8;
  stringstream local_1a0 [8];
  stringstream buffer;
  ostream local_190 [376];
  int local_18 [2];
  Parser *local_10;
  Parser *this_local;
  
  pAVar3 = this->current_;
  local_18[1] = 0x3e;
  local_18[0] = 1;
  local_10 = this;
  pTVar2 = forward_token(this,local_18);
  pAVar3 = AbstractSyntaxNode::add_child(pAVar3,(Type *)(local_18 + 1),pTVar2);
  this->current_ = pAVar3;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1fc = kLeftBracket;
  match(&local_1f8,this,&local_1fc);
  Token::~Token(&local_1f8);
  local_214[1] = 1;
  pTVar2 = forward_token(this,local_214 + 1);
  TVar1 = Token::type(pTVar2);
  if (TVar1 == kIntegerLiteral) {
    pAVar3 = this->current_;
    local_214[0] = 1;
    pTVar2 = forward_token(this,local_214);
    AbstractSyntaxNode::add_child(pAVar3,pTVar2);
    local_27c[2] = 0x22;
    match(&local_270,this,(Type *)(local_27c + 2));
    Token::~Token(&local_270);
  }
  else {
    local_27c[1] = 1;
    pTVar2 = forward_token(this,local_27c + 1);
    TVar1 = Token::type(pTVar2);
    if (TVar1 != kIdentity) {
      poVar4 = std::operator<<(local_190,anon_var_dwarf_5f8ef);
      local_304 = 1;
      pTVar2 = forward_token(this,&local_304);
      Token::content_abi_cxx11_(&local_300,pTVar2);
      poVar4 = std::operator<<(poVar4,(string *)&local_300);
      std::operator<<(poVar4,anon_var_dwarf_5f997);
      std::__cxx11::string::~string((string *)&local_300);
      local_349 = 1;
      this_00 = (parser_exception *)__cxa_allocate_exception(0x40);
      local_324 = 1;
      pTVar2 = forward_token(this,&local_324);
      Token::position(&local_320,pTVar2);
      std::__cxx11::stringstream::str();
      parser_exception::parser_exception(this_00,&local_320,&local_348);
      local_349 = 0;
      __cxa_throw(this_00,&parser_exception::typeinfo,parser_exception::~parser_exception);
    }
    pAVar3 = this->current_;
    local_27c[0] = 1;
    pTVar2 = forward_token(this,local_27c);
    AbstractSyntaxNode::add_child(pAVar3,pTVar2);
    local_2dc = kIdentity;
    match(&local_2d8,this,&local_2dc);
    Token::~Token(&local_2d8);
  }
  local_3ac = kRightBracket;
  match(&local_3a8,this,&local_3ac);
  Token::~Token(&local_3a8);
  pAVar3 = AbstractSyntaxNode::parent(this->current_);
  this->current_ = pAVar3;
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void Parser::parse_array() {
    current_ = current_->add_child(Token::Type::kArray, forward_token());
    std::stringstream buffer;

    match(Token::Type::kLeftBracket);
    if (forward_token().type() == Token::Type::kIntegerLiteral) {
        current_->add_child(forward_token());
        match(Token::Type::kIntegerLiteral);
    } else if (forward_token().type() == Token::Type::kIdentity) {
        current_->add_child(forward_token());
        match(Token::Type::kIdentity);
    } else {
        buffer << "无效的标识符 \"" << forward_token().content() << "\", 数组括号中仅允许整数常量或变量(变量仅限用作左值)";
        throw parser_exception(forward_token().position(), buffer.str());
    }
    match(Token::Type::kRightBracket);

    current_ = current_->parent();
}